

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::
CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,Diligent::BufferData_const*,bool>
          (RenderDeviceBase<Diligent::EngineGLImplTraits> *this,IBuffer **ppBuffer,
          BufferDesc *BuffDesc,reference_wrapper<Diligent::GLContextState> *ExtraArgs,
          BufferData **ExtraArgs_1,bool *ExtraArgs_2)

{
  anon_class_48_6_215cb50b ConstructObject;
  bool *ExtraArgs_local_2;
  BufferData **ExtraArgs_local_1;
  reference_wrapper<Diligent::GLContextState> *ExtraArgs_local;
  BufferDesc *BuffDesc_local;
  IBuffer **ppBuffer_local;
  RenderDeviceBase<Diligent::EngineGLImplTraits> *this_local;
  
  ConstructObject.BuffDesc = BuffDesc;
  ConstructObject.this = this;
  ConstructObject.ExtraArgs = ExtraArgs;
  ConstructObject._24_8_ = ExtraArgs_1;
  ConstructObject._32_8_ = ExtraArgs_2;
  ConstructObject.ppBuffer = (IBuffer ***)&BuffDesc_local;
  BuffDesc_local = (BufferDesc *)ppBuffer;
  ppBuffer_local = (IBuffer **)this;
  CreateDeviceObject<Diligent::IBuffer,Diligent::BufferDesc,Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateBufferImpl<std::reference_wrapper<Diligent::GLContextState>,Diligent::BufferData_const*,bool>(Diligent::IBuffer**,Diligent::BufferDesc_const&,std::reference_wrapper<Diligent::GLContextState>const&,Diligent::BufferData_const*const&,bool_const&)::_lambda()_1_>
            (this,"Buffer",BuffDesc,ppBuffer,ConstructObject);
  return;
}

Assistant:

void CreateBufferImpl(IBuffer** ppBuffer, const BufferDesc& BuffDesc, const ExtraArgsType&... ExtraArgs)
    {
        CreateDeviceObject("Buffer", BuffDesc, ppBuffer,
                           [&]() //
                           {
                               BufferImplType* pBufferImpl = NEW_RC_OBJ(m_BufObjAllocator, "Buffer instance", BufferImplType)(m_BuffViewObjAllocator, static_cast<RenderDeviceImplType*>(this), BuffDesc, ExtraArgs...);
                               pBufferImpl->QueryInterface(IID_Buffer, reinterpret_cast<IObject**>(ppBuffer));
                               pBufferImpl->CreateDefaultViews();
                           });
    }